

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_> __thiscall
capnp::compiler::NodeTranslator::BrandScope::setParams
          (BrandScope *this,Array<capnp::compiler::NodeTranslator::BrandedDecl> *params,
          Which genericType,Reader source)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  uint *puVar4;
  BrandedDecl *pBVar5;
  size_t sVar6;
  _func_int **pp_Var7;
  BrandScope *this_00;
  short in_CX;
  char *pcVar8;
  undefined6 in_register_00000012;
  long *plVar9;
  ulong uVar10;
  BrandScope *extraout_RDX;
  BrandScope *extraout_RDX_00;
  BrandScope *extraout_RDX_01;
  BrandScope *pBVar11;
  ulong uVar12;
  ulong uVar13;
  ArrayDisposer *pAVar14;
  undefined8 uVar15;
  Refcounted *refcounted;
  long lVar16;
  Array<capnp::compiler::NodeTranslator::BrandedDecl> *__range6;
  Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_> MVar17;
  Array<capnp::compiler::NodeTranslator::BrandedDecl> local_58;
  BrandScope *local_38;
  
  plVar9 = (long *)CONCAT62(in_register_00000012,genericType);
  if (params[2].disposer == (ArrayDisposer *)0x0) {
    uVar10 = plVar9[1];
    uVar12 = (ulong)*(uint *)&params[2].ptr;
    if (uVar12 < uVar10) {
      pAVar14 = params->disposer;
      uVar10 = 0;
      if (uVar12 == 0) {
        uVar12 = 0;
        if (0x3f < source._reader.dataSize) {
          uVar12 = (ulong)*(uint *)((long)source._reader.data + 4);
        }
        if (0x9f < source._reader.dataSize) {
          uVar10 = (ulong)*(uint *)((long)source._reader.data + 0x10);
        }
        pp_Var7 = pAVar14->_vptr_ArrayDisposer;
        pcVar8 = "Declaration does not accept generic parameters.";
        uVar15 = 0x30;
      }
      else {
        uVar12 = 0;
        if (0x3f < source._reader.dataSize) {
          uVar12 = (ulong)*(uint *)((long)source._reader.data + 4);
        }
        if (0x9f < source._reader.dataSize) {
          uVar10 = (ulong)*(uint *)((long)source._reader.data + 0x10);
        }
        pp_Var7 = pAVar14->_vptr_ArrayDisposer;
        pcVar8 = "Too many generic parameters.";
        uVar15 = 0x1d;
      }
    }
    else {
      if (uVar12 <= uVar10) {
        local_38 = this;
        if ((in_CX != 0x1c) && (uVar10 != 0)) {
          lVar3 = *plVar9;
          lVar16 = 0;
          do {
            if ((*(int *)(lVar3 + lVar16) != 2) &&
               ((uVar1 = *(ushort *)(lVar3 + 0x20 + lVar16), 0x1e < uVar1 ||
                ((0x5c000220U >> (uVar1 & 0x1f) & 1) == 0)))) {
              uVar2 = *(uint *)(lVar3 + 0x98 + lVar16);
              uVar12 = 0;
              uVar13 = 0;
              if (0x3f < uVar2) {
                uVar13 = (ulong)*(uint *)(*(long *)(lVar3 + 0x88 + lVar16) + 4);
              }
              if (0x9f < uVar2) {
                uVar12 = (ulong)*(uint *)(*(long *)(lVar3 + 0x88 + lVar16) + 0x10);
              }
              (**params->disposer->_vptr_ArrayDisposer)
                        (params->disposer,uVar13,uVar12,
                         "Sorry, only pointer types can be used as generic parameters.",0x3d);
            }
            lVar16 = lVar16 + 0xa8;
          } while (uVar10 * 0xa8 - lVar16 != 0);
        }
        this_00 = (BrandScope *)operator_new(0x50);
        local_58.ptr = (BrandedDecl *)*plVar9;
        local_58.size_ = plVar9[1];
        local_58.disposer = (ArrayDisposer *)plVar9[2];
        *plVar9 = 0;
        plVar9[1] = 0;
        BrandScope(this_00,(BrandScope *)params,&local_58);
        sVar6 = local_58.size_;
        pBVar5 = local_58.ptr;
        puVar4 = &(this_00->super_Refcounted).refcount;
        *puVar4 = *puVar4 + 1;
        pBVar11 = extraout_RDX_00;
        if (local_58.ptr != (BrandedDecl *)0x0) {
          local_58.ptr = (BrandedDecl *)0x0;
          local_58.size_ = 0;
          (**(local_58.disposer)->_vptr_ArrayDisposer)
                    (local_58.disposer,pBVar5,0xa8,sVar6,sVar6,
                     kj::ArrayDisposer::
                     Dispose_<capnp::compiler::NodeTranslator::BrandedDecl,_false>::destruct);
          pBVar11 = extraout_RDX_01;
        }
        (local_38->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)this_00;
        *(BrandScope **)&(local_38->super_Refcounted).refcount = this_00;
        this = local_38;
        goto LAB_00453b7c;
      }
      uVar10 = 0;
      uVar12 = 0;
      if (0x3f < source._reader.dataSize) {
        uVar12 = (ulong)*(uint *)((long)source._reader.data + 4);
      }
      pAVar14 = params->disposer;
      if (0x9f < source._reader.dataSize) {
        uVar10 = (ulong)*(uint *)((long)source._reader.data + 0x10);
      }
      pp_Var7 = pAVar14->_vptr_ArrayDisposer;
      pcVar8 = "Not enough generic parameters.";
      uVar15 = 0x1f;
    }
  }
  else {
    uVar10 = 0;
    uVar12 = 0;
    if (0x3f < source._reader.dataSize) {
      uVar12 = (ulong)*(uint *)((long)source._reader.data + 4);
    }
    pAVar14 = params->disposer;
    if (0x9f < source._reader.dataSize) {
      uVar10 = (ulong)*(uint *)((long)source._reader.data + 0x10);
    }
    pp_Var7 = pAVar14->_vptr_ArrayDisposer;
    pcVar8 = "Double-application of generic parameters.";
    uVar15 = 0x2a;
  }
  (**pp_Var7)(pAVar14,uVar12,uVar10,pcVar8,uVar15);
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
  *(undefined8 *)&(this->super_Refcounted).refcount = 0;
  pBVar11 = extraout_RDX;
LAB_00453b7c:
  MVar17.ptr.ptr = pBVar11;
  MVar17.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_>)MVar17.ptr;
}

Assistant:

kj::Maybe<kj::Own<BrandScope>> setParams(
      kj::Array<BrandedDecl> params, Declaration::Which genericType, Expression::Reader source) {
    if (this->params.size() != 0) {
      errorReporter.addErrorOn(source, "Double-application of generic parameters.");
      return nullptr;
    } else if (params.size() > leafParamCount) {
      if (leafParamCount == 0) {
        errorReporter.addErrorOn(source, "Declaration does not accept generic parameters.");
      } else {
        errorReporter.addErrorOn(source, "Too many generic parameters.");
      }
      return nullptr;
    } else if (params.size() < leafParamCount) {
      errorReporter.addErrorOn(source, "Not enough generic parameters.");
      return nullptr;
    } else {
      if (genericType != Declaration::BUILTIN_LIST) {
        for (auto& param: params) {
          KJ_IF_MAYBE(kind, param.getKind()) {
            switch (*kind) {
              case Declaration::BUILTIN_LIST:
              case Declaration::BUILTIN_TEXT:
              case Declaration::BUILTIN_DATA:
              case Declaration::BUILTIN_ANY_POINTER:
              case Declaration::STRUCT:
              case Declaration::INTERFACE:
                break;

              default:
                param.addError(errorReporter,
                    "Sorry, only pointer types can be used as generic parameters.");
                break;
            }
          }
        }
      }

      return kj::refcounted<BrandScope>(*this, kj::mv(params));
    }
  }